

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestCase * __thiscall testing::UnitTest::GetMutableTestCase(UnitTest *this,int i)

{
  UnitTestImpl *this_00;
  TestCase *pTVar1;
  int i_local;
  UnitTest *this_local;
  
  this_00 = impl(this);
  pTVar1 = internal::UnitTestImpl::GetMutableTestCase(this_00,i);
  return pTVar1;
}

Assistant:

TestCase* UnitTest::GetMutableTestCase(int i) {
  return impl()->GetMutableTestCase(i);
}